

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb_fastpforlib::internal::__fastunpack18(uint32_t *in,uint32_t *out)

{
  uint32_t *local_8;
  
  local_8 = in;
  Unroller<(unsigned_short)18,_(unsigned_short)0>::Unpack(&local_8,out);
  return;
}

Assistant:

void __fastunpack18(const uint32_t *__restrict in, uint32_t *__restrict out) {
	Unroller<18>::Unpack(in, out);
}